

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

DataBlobImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::DataBlobImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::DataBlobImpl,Diligent::IMemoryAllocator> *this,
          IMemoryAllocator *CtorArgs,unsigned_long *CtorArgs_1,void **CtorArgs_2)

{
  IMemoryAllocator *pIVar1;
  DataBlobImpl *local_40;
  DataBlobImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  void **CtorArgs_local_2;
  unsigned_long *CtorArgs_local_1;
  IMemoryAllocator *CtorArgs_local;
  MakeNewRCObj<Diligent::DataBlobImpl,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pIVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (DataBlobImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (DataBlobImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_40 = (DataBlobImpl *)
               RefCountedObject<Diligent::IDataBlob>::operator_new
                         ((RefCountedObject<Diligent::IDataBlob> *)0x48,(size_t)pIVar1);
    DataBlobImpl::DataBlobImpl(local_40,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2)
    ;
  }
  else {
    local_40 = (DataBlobImpl *)
               new<Diligent::IMemoryAllocator>
                         (0x48,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    DataBlobImpl::DataBlobImpl(local_40,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,*CtorArgs_2)
    ;
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::DataBlobImpl,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_40,*(IMemoryAllocator **)this);
  }
  return local_40;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }